

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMax(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *uvec,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *p_low,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_up,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *eps,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *p_delta,int start,int incr)

{
  Real RVar1;
  int32_t iVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  fpclass_type fVar6;
  Status SVar7;
  int iVar8;
  long lVar9;
  pointer pnVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  pointer pnVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  undefined4 *puVar15;
  pointer pnVar16;
  undefined4 *puVar17;
  uint *puVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  uint uVar21;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar22;
  long in_FS_OFFSET;
  byte bVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_1028 [120];
  undefined8 local_fb0;
  cpp_dec_float<200U,_int,_void> *local_fa8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_fa0;
  double local_f98;
  undefined8 uStack_f90;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f88;
  undefined8 uStack_f80;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f78;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f70;
  undefined1 local_f68 [120];
  double local_ef0;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ee8;
  undefined8 uStack_ee0;
  double local_ed8;
  pointer local_ed0;
  cpp_dec_float<200U,_int,_void> *local_ec8;
  Random *local_ec0;
  undefined1 local_eb8 [124];
  int32_t iStack_e3c;
  undefined1 local_e38 [128];
  undefined1 local_db8 [128];
  double local_d38;
  undefined8 uStack_d30;
  double local_d28;
  undefined8 uStack_d20;
  cpp_dec_float<200U,_int,_void> local_d18;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined5 uStack_c30;
  undefined3 uStack_c2b;
  undefined5 uStack_c28;
  undefined8 local_c20;
  cpp_dec_float<200U,_int,_void> local_c18;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined5 uStack_b30;
  undefined3 uStack_b2b;
  undefined5 uStack_b28;
  undefined8 local_b20;
  cpp_dec_float<200U,_int,_void> local_b18;
  cpp_dec_float<200U,_int,_void> local_a98;
  cpp_dec_float<200U,_int,_void> local_a10;
  cpp_dec_float<200U,_int,_void> local_990;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_910;
  undefined1 local_890 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_810;
  undefined1 local_790 [128];
  undefined1 local_710 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_690;
  undefined1 local_610 [128];
  undefined1 local_590 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_510;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_490;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_410;
  undefined1 local_390 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_310;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_290;
  undefined1 local_210 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_190;
  uint local_110 [28];
  undefined4 local_a0 [28];
  
  bVar23 = 0;
  local_ed0 = (uvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_a98.fpclass = cpp_dec_float_finite;
  local_a98.prec_elem = 0x1c;
  local_a98.data._M_elems[0] = 0;
  local_a98.data._M_elems[1] = 0;
  local_a98.data._M_elems[2] = 0;
  local_a98.data._M_elems[3] = 0;
  local_a98.data._M_elems[4] = 0;
  local_a98.data._M_elems[5] = 0;
  local_a98.data._M_elems[6] = 0;
  local_a98.data._M_elems[7] = 0;
  local_a98.data._M_elems[8] = 0;
  local_a98.data._M_elems[9] = 0;
  local_a98.data._M_elems[10] = 0;
  local_a98.data._M_elems[0xb] = 0;
  local_a98.data._M_elems[0xc] = 0;
  local_a98.data._M_elems[0xd] = 0;
  local_a98.data._M_elems[0xe] = 0;
  local_a98.data._M_elems[0xf] = 0;
  local_a98.data._M_elems[0x10] = 0;
  local_a98.data._M_elems[0x11] = 0;
  local_a98.data._M_elems[0x12] = 0;
  local_a98.data._M_elems[0x13] = 0;
  local_a98.data._M_elems[0x14] = 0;
  local_a98.data._M_elems[0x15] = 0;
  local_a98.data._M_elems[0x16] = 0;
  local_a98.data._M_elems[0x17] = 0;
  local_a98.data._M_elems[0x18] = 0;
  local_a98.data._M_elems[0x19] = 0;
  local_a98.data._M_elems._104_5_ = 0;
  local_a98.data._M_elems[0x1b]._1_3_ = 0;
  local_a98.exp = 0;
  local_a98.neg = false;
  local_fb0._0_4_ = cpp_dec_float_finite;
  local_fb0._4_4_ = 0x1c;
  local_1028._0_4_ = 0;
  local_1028._4_4_ = 0;
  local_1028._8_4_ = 0;
  local_1028._12_4_ = 0;
  local_1028._16_4_ = 0;
  local_1028._20_4_ = 0;
  local_1028._24_4_ = 0;
  local_1028._28_4_ = 0;
  local_1028._32_4_ = 0;
  local_1028._36_4_ = 0;
  local_1028._40_4_ = 0;
  local_1028._44_4_ = 0;
  local_1028._48_4_ = 0;
  local_1028._52_4_ = 0;
  local_1028._56_4_ = 0;
  local_1028._60_4_ = 0;
  local_1028._64_4_ = 0;
  local_1028._68_4_ = 0;
  local_1028._72_4_ = 0;
  local_1028._76_4_ = 0;
  local_1028._80_4_ = 0;
  local_1028._84_4_ = 0;
  local_1028._88_4_ = 0;
  local_1028._92_4_ = 0;
  local_1028._96_4_ = 0;
  local_1028._100_4_ = 0;
  local_1028._104_5_ = 0;
  local_1028._109_3_ = 0;
  local_1028._112_4_ = 0;
  local_1028[0x74] = false;
  local_fa0 = this;
  local_f88 = uvec;
  local_f78 = p_low;
  local_f70 = p_up;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_1028,10.0);
  if (&local_a98 != &p_delta->m_backend) {
    pnVar14 = p_delta;
    pcVar12 = &local_a98;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar12->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_a98.exp = (p_delta->m_backend).exp;
    local_a98.neg = (p_delta->m_backend).neg;
    local_a98.fpclass = (p_delta->m_backend).fpclass;
    local_a98.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_a98,(cpp_dec_float<200U,_int,_void> *)local_1028);
  local_b18.fpclass = cpp_dec_float_finite;
  local_b18.prec_elem = 0x1c;
  local_b18.data._M_elems[0] = 0;
  local_b18.data._M_elems[1] = 0;
  local_b18.data._M_elems[2] = 0;
  local_b18.data._M_elems[3] = 0;
  local_b18.data._M_elems[4] = 0;
  local_b18.data._M_elems[5] = 0;
  local_b18.data._M_elems[6] = 0;
  local_b18.data._M_elems[7] = 0;
  local_b18.data._M_elems[8] = 0;
  local_b18.data._M_elems[9] = 0;
  local_b18.data._M_elems[10] = 0;
  local_b18.data._M_elems[0xb] = 0;
  local_b18.data._M_elems[0xc] = 0;
  local_b18.data._M_elems[0xd] = 0;
  local_b18.data._M_elems[0xe] = 0;
  local_b18.data._M_elems[0xf] = 0;
  local_b18.data._M_elems[0x10] = 0;
  local_b18.data._M_elems[0x11] = 0;
  local_b18.data._M_elems[0x12] = 0;
  local_b18.data._M_elems[0x13] = 0;
  local_b18.data._M_elems[0x14] = 0;
  local_b18.data._M_elems[0x15] = 0;
  local_b18.data._M_elems[0x16] = 0;
  local_b18.data._M_elems[0x17] = 0;
  local_b18.data._M_elems[0x18] = 0;
  local_b18.data._M_elems[0x19] = 0;
  local_b18.data._M_elems._104_5_ = 0;
  local_b18.data._M_elems[0x1b]._1_3_ = 0;
  local_b18.exp = 0;
  local_b18.neg = false;
  local_fb0 = 5.94158821470276e-313;
  local_1028._0_4_ = 0;
  local_1028._4_4_ = 0;
  local_1028._8_4_ = 0;
  local_1028._12_4_ = 0;
  local_1028._16_4_ = 0;
  local_1028._20_4_ = 0;
  local_1028._24_4_ = 0;
  local_1028._28_4_ = 0;
  local_1028._32_4_ = 0;
  local_1028._36_4_ = 0;
  local_1028._40_4_ = 0;
  local_1028._44_4_ = 0;
  local_1028._48_4_ = 0;
  local_1028._52_4_ = 0;
  local_1028._56_4_ = 0;
  local_1028._60_4_ = 0;
  local_1028._64_4_ = 0;
  local_1028._68_4_ = 0;
  local_1028._72_4_ = 0;
  local_1028._76_4_ = 0;
  local_1028._80_4_ = 0;
  local_1028._84_4_ = 0;
  local_1028._88_4_ = 0;
  local_1028._92_4_ = 0;
  local_1028._96_4_ = 0;
  local_1028._100_4_ = 0;
  local_1028._104_5_ = 0;
  local_1028._109_3_ = 0;
  local_1028._112_4_ = 0;
  local_1028[0x74] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_1028,100.0);
  if (&local_b18 != &p_delta->m_backend) {
    pnVar14 = p_delta;
    pcVar12 = &local_b18;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar12->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_b18.exp = (p_delta->m_backend).exp;
    local_b18.neg = (p_delta->m_backend).neg;
    local_b18.fpclass = (p_delta->m_backend).fpclass;
    local_b18.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_b18,(cpp_dec_float<200U,_int,_void> *)local_1028);
  local_db8._0_4_ = 0;
  local_db8._4_4_ = 0;
  local_db8._8_4_ = 0;
  local_db8._12_4_ = 0;
  local_db8._16_4_ = 0;
  local_db8._20_4_ = 0;
  local_db8._24_4_ = 0;
  local_db8._28_4_ = 0;
  local_db8._32_4_ = 0;
  local_db8._36_4_ = 0;
  local_db8._40_4_ = 0;
  local_db8._44_4_ = 0;
  local_db8._48_4_ = 0;
  local_db8._52_4_ = 0;
  local_db8._56_4_ = 0;
  local_db8._60_4_ = 0;
  local_db8._64_4_ = 0;
  local_db8._68_4_ = 0;
  local_db8._72_4_ = 0;
  local_db8._76_4_ = 0;
  local_db8._80_4_ = 0;
  local_db8._84_4_ = 0;
  local_db8._88_4_ = 0;
  local_db8._92_4_ = 0;
  local_db8._96_4_ = 0;
  local_db8._100_4_ = 0;
  local_db8._104_5_ = 0;
  local_db8._109_3_ = 0;
  local_e38._0_4_ = 0;
  local_e38._4_4_ = 0;
  local_e38._8_4_ = 0;
  local_e38._12_4_ = 0;
  local_e38._16_4_ = 0;
  local_e38._20_4_ = 0;
  local_e38._24_4_ = 0;
  local_e38._28_4_ = 0;
  local_e38._32_4_ = 0;
  local_e38._36_4_ = 0;
  local_e38._40_4_ = 0;
  local_e38._44_4_ = 0;
  local_e38._48_4_ = 0;
  local_e38._52_4_ = 0;
  local_e38._56_4_ = 0;
  local_e38._60_4_ = 0;
  local_e38._64_4_ = 0;
  local_e38._68_4_ = 0;
  local_e38._72_4_ = 0;
  local_e38._76_4_ = 0;
  local_e38._80_4_ = 0;
  local_e38._84_4_ = 0;
  local_e38._88_4_ = 0;
  local_e38._92_4_ = 0;
  local_e38._96_4_ = 0;
  local_e38._100_4_ = 0;
  local_e38._104_5_ = 0;
  local_e38._109_3_ = 0;
  local_eb8._0_4_ = 0;
  local_eb8._4_4_ = 0;
  local_eb8._8_4_ = 0;
  local_eb8._12_4_ = 0;
  local_eb8._16_4_ = 0;
  local_eb8._20_4_ = 0;
  local_eb8._24_4_ = 0;
  local_eb8._28_4_ = 0;
  local_eb8._32_4_ = 0;
  local_eb8._36_4_ = 0;
  local_eb8._40_4_ = 0;
  local_eb8._44_4_ = 0;
  local_eb8._48_4_ = 0;
  local_eb8._52_4_ = 0;
  local_eb8._56_4_ = 0;
  local_eb8._60_4_ = 0;
  local_eb8._64_4_ = 0;
  local_eb8._68_4_ = 0;
  local_eb8._72_4_ = 0;
  local_eb8._76_4_ = 0;
  local_eb8._80_4_ = 0;
  local_eb8._84_4_ = 0;
  local_eb8._88_4_ = 0;
  local_eb8._92_4_ = 0;
  local_eb8._96_4_ = 0;
  local_eb8._100_4_ = 0;
  local_eb8._104_5_ = 0;
  local_eb8._109_3_ = 0;
  if (local_fa0->fullPerturbation == true) {
    pnVar14 = p_delta;
    pnVar19 = eps;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    (eps->m_backend).exp = (p_delta->m_backend).exp;
    (eps->m_backend).neg = (p_delta->m_backend).neg;
    iVar2 = (p_delta->m_backend).prec_elem;
    (eps->m_backend).fpclass = (p_delta->m_backend).fpclass;
    (eps->m_backend).prec_elem = iVar2;
    uVar21 = (int)((ulong)((long)(local_f88->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_f88->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 7) + ~start;
    if (-1 < (int)uVar21) {
      local_f88 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    **)(in_FS_OFFSET + -8);
      local_fa8 = (cpp_dec_float<200U,_int,_void> *)&local_fa0->random;
      local_fa0 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_fa0->theShift;
      uStack_f80 = 0;
      local_d38 = -(double)local_f88;
      uStack_d30 = 0x8000000000000000;
      do {
        pnVar10 = (local_f70->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar13 = pnVar10 + uVar21;
        puVar11 = (uint *)local_eb8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar11 = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
        }
        local_eb8._112_4_ = pnVar10[uVar21].m_backend.exp;
        local_eb8[0x74] = pnVar10[uVar21].m_backend.neg;
        local_eb8._120_4_ = pnVar10[uVar21].m_backend.fpclass;
        iStack_e3c = pnVar10[uVar21].m_backend.prec_elem;
        pnVar10 = (local_f78->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar13 = pnVar10 + uVar21;
        puVar11 = (uint *)local_e38;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar11 = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
        }
        local_e38._112_4_ = pnVar10[uVar21].m_backend.exp;
        local_e38[0x74] = pnVar10[uVar21].m_backend.neg;
        local_e38._120_4_ = pnVar10[uVar21].m_backend.fpclass;
        local_e38._124_4_ = pnVar10[uVar21].m_backend.prec_elem;
        pnVar10 = local_ed0 + uVar21;
        puVar15 = (undefined4 *)local_db8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = *(undefined4 *)&pnVar10->m_backend;
          pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        }
        local_db8._112_4_ = *(int *)((long)(local_ed0 + uVar21) + 0x70);
        local_db8[0x74] = *(bool *)((long)(local_ed0 + uVar21) + 0x74);
        local_db8._120_8_ = *(double *)((long)(local_ed0 + uVar21) + 0x78);
        puVar11 = (uint *)local_eb8;
        pnVar14 = &local_910;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = *puVar11;
          puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
        }
        local_910.m_backend.exp = local_eb8._112_4_;
        local_910.m_backend.neg = local_eb8[0x74];
        local_910.m_backend.fpclass = local_eb8._120_4_;
        local_910.m_backend.prec_elem = iStack_e3c;
        ::soplex::infinity::__tls_init();
        local_b20 = 0x1c00000000;
        local_b98 = 0;
        uStack_b90 = 0;
        local_b88 = 0;
        uStack_b80 = 0;
        local_b78 = 0;
        uStack_b70 = 0;
        local_b68 = 0;
        uStack_b60 = 0;
        local_b58 = 0;
        uStack_b50 = 0;
        local_b48 = 0;
        uStack_b40 = 0;
        local_b38 = 0;
        uStack_b30 = 0;
        uStack_b2b = 0;
        uStack_b28 = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_b98,(double)local_f88);
        pnVar14 = eps;
        pnVar19 = &local_190;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
        }
        local_190.m_backend.exp = (eps->m_backend).exp;
        local_190.m_backend.neg = (eps->m_backend).neg;
        local_190.m_backend.fpclass = (eps->m_backend).fpclass;
        local_190.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar4 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_910,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_b98,&local_190);
        if (bVar4) {
          puVar11 = (uint *)local_e38;
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_210;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = *puVar11;
            puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_210._112_4_ = local_e38._112_4_;
          local_210[0x74] = local_e38[0x74];
          local_210._120_8_ = local_e38._120_8_;
          puVar11 = (uint *)local_eb8;
          pnVar14 = &local_290;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = *puVar11;
            puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_290.m_backend.exp = local_eb8._112_4_;
          local_290.m_backend.neg = local_eb8[0x74];
          local_290.m_backend.fpclass = local_eb8._120_4_;
          local_290.m_backend.prec_elem = iStack_e3c;
          pnVar14 = eps;
          pnVar19 = &local_310;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_310.m_backend.exp = (eps->m_backend).exp;
          local_310.m_backend.neg = (eps->m_backend).neg;
          local_310.m_backend.fpclass = (eps->m_backend).fpclass;
          local_310.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar4 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_210,&local_290,&local_310);
          if (bVar4) {
            local_fb0 = 5.94158821470276e-313;
            local_1028._0_4_ = 0;
            local_1028._4_4_ = 0;
            local_1028._8_4_ = 0;
            local_1028._12_4_ = 0;
            local_1028._16_4_ = 0;
            local_1028._20_4_ = 0;
            local_1028._24_4_ = 0;
            local_1028._28_4_ = 0;
            local_1028._32_4_ = 0;
            local_1028._36_4_ = 0;
            local_1028._40_4_ = 0;
            local_1028._44_4_ = 0;
            local_1028._48_4_ = 0;
            local_1028._52_4_ = 0;
            local_1028._56_4_ = 0;
            local_1028._60_4_ = 0;
            local_1028._64_4_ = 0;
            local_1028._68_4_ = 0;
            local_1028._72_4_ = 0;
            local_1028._76_4_ = 0;
            local_1028._80_4_ = 0;
            local_1028._84_4_ = 0;
            local_1028._88_4_ = 0;
            local_1028._92_4_ = 0;
            local_1028._96_4_ = 0;
            local_1028._100_4_ = 0;
            local_1028._104_5_ = 0;
            local_1028._109_3_ = 0;
            local_1028._112_4_ = 0;
            local_1028[0x74] = false;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_db8;
            if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_1028 != eps) {
              puVar11 = (uint *)local_1028;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar11 = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4)
                ;
                puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
              }
              local_1028._112_4_ = local_db8._112_4_;
              local_1028[0x74] = local_db8[0x74];
              local_fb0 = (double)local_db8._120_8_;
              pcVar12 = &eps->m_backend;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_1028,pcVar12);
            if (((local_eb8._120_4_ != cpp_dec_float_NaN) &&
                ((fpclass_type)local_fb0 != cpp_dec_float_NaN)) &&
               (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_eb8,
                                   (cpp_dec_float<200U,_int,_void> *)local_1028), iVar5 < 1)) {
              local_ee8 = (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             extract_double(&local_a98);
              local_f98 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          extract_double(&local_b18);
              RVar1 = Random::next_random((Random *)local_fa8);
              local_ef0 = 5.94158821470276e-313;
              local_f68._0_4_ = 0;
              local_f68._4_4_ = 0;
              local_f68._8_4_ = 0;
              local_f68._12_4_ = 0;
              local_f68._16_4_ = 0;
              local_f68._20_4_ = 0;
              local_f68._24_4_ = 0;
              local_f68._28_4_ = 0;
              local_f68._32_4_ = 0;
              local_f68._36_4_ = 0;
              local_f68._40_4_ = 0;
              local_f68._44_4_ = 0;
              local_f68._48_4_ = 0;
              local_f68._52_4_ = 0;
              local_f68._56_4_ = 0;
              local_f68._60_4_ = 0;
              local_f68._64_4_ = 0;
              local_f68._68_4_ = 0;
              local_f68._72_4_ = 0;
              local_f68._76_4_ = 0;
              local_f68._80_4_ = 0;
              local_f68._84_4_ = 0;
              local_f68._88_4_ = 0;
              local_f68._92_4_ = 0;
              local_f68._96_4_ = 0;
              local_f68._100_4_ = 0;
              local_f68._104_5_ = 0;
              local_f68._109_3_ = 0;
              local_f68._112_4_ = 0;
              local_f68[0x74] = false;
              local_fb0._0_4_ = cpp_dec_float_finite;
              local_fb0._4_4_ = 0x1c;
              local_1028._0_4_ = 0;
              local_1028._4_4_ = 0;
              local_1028._8_4_ = 0;
              local_1028._12_4_ = 0;
              local_1028._16_4_ = 0;
              local_1028._20_4_ = 0;
              local_1028._24_4_ = 0;
              local_1028._28_4_ = 0;
              local_1028._32_4_ = 0;
              local_1028._36_4_ = 0;
              local_1028._40_4_ = 0;
              local_1028._44_4_ = 0;
              local_1028._48_4_ = 0;
              local_1028._52_4_ = 0;
              local_1028._56_4_ = 0;
              local_1028._60_4_ = 0;
              local_1028._64_4_ = 0;
              local_1028._68_4_ = 0;
              local_1028._72_4_ = 0;
              local_1028._76_4_ = 0;
              local_1028._80_4_ = 0;
              local_1028._84_4_ = 0;
              local_1028._88_4_ = 0;
              local_1028._92_4_ = 0;
              local_1028._96_4_ = 0;
              local_1028._100_4_ = 0;
              local_1028._104_5_ = 0;
              local_1028._109_3_ = 0;
              local_1028._112_4_ = 0;
              local_1028[0x74] = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_1028,
                         RVar1 * local_f98 + (1.0 - RVar1) * (double)local_ee8);
              puVar11 = (uint *)local_db8;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_f68;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar12->data)._M_elems[0] = *puVar11;
                puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4)
                ;
              }
              local_f68._112_4_ = local_db8._112_4_;
              local_f68[0x74] = local_db8[0x74];
              local_ef0 = (double)local_db8._120_8_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_f68,
                         (cpp_dec_float<200U,_int,_void> *)local_1028);
              pnVar10 = (local_f70->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_f68;
              pnVar13 = pnVar10 + uVar21;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar13->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4)
                ;
                pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              pnVar10[uVar21].m_backend.exp = local_f68._112_4_;
              pnVar10[uVar21].m_backend.neg = local_f68[0x74];
              *(double *)&pnVar10[uVar21].m_backend.fpclass = local_ef0;
              pnVar10 = (local_f70->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar21;
              local_fb0 = 5.94158821470276e-313;
              local_1028._0_4_ = 0;
              local_1028._4_4_ = 0;
              local_1028._8_4_ = 0;
              local_1028._12_4_ = 0;
              local_1028._16_4_ = 0;
              local_1028._20_4_ = 0;
              local_1028._24_4_ = 0;
              local_1028._28_4_ = 0;
              local_1028._32_4_ = 0;
              local_1028._36_4_ = 0;
              local_1028._40_4_ = 0;
              local_1028._44_4_ = 0;
              local_1028._48_4_ = 0;
              local_1028._52_4_ = 0;
              local_1028._56_4_ = 0;
              local_1028._60_4_ = 0;
              local_1028._64_4_ = 0;
              local_1028._68_4_ = 0;
              local_1028._72_4_ = 0;
              local_1028._76_4_ = 0;
              local_1028._80_4_ = 0;
              local_1028._84_4_ = 0;
              local_1028._88_4_ = 0;
              local_1028._92_4_ = 0;
              local_1028._96_4_ = 0;
              local_1028._100_4_ = 0;
              local_1028._104_5_ = 0;
              local_1028._109_3_ = 0;
              local_1028._112_4_ = 0;
              local_1028[0x74] = false;
              if ((pointer)local_1028 != pnVar10) {
                pnVar13 = pnVar10;
                puVar15 = (undefined4 *)local_1028;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  *puVar15 = (pnVar13->m_backend).data._M_elems[0];
                  pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
                  puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                }
                local_1028._112_4_ = (pnVar10->m_backend).exp;
                local_1028[0x74] = (pnVar10->m_backend).neg;
                local_fb0 = *(double *)&(pnVar10->m_backend).fpclass;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_1028,
                         (cpp_dec_float<200U,_int,_void> *)local_eb8);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_fa0,
                         (cpp_dec_float<200U,_int,_void> *)local_1028);
            }
          }
        }
        bVar4 = local_e38[0x74];
        uVar3 = local_e38._112_4_;
        puVar15 = (undefined4 *)local_e38;
        puVar17 = local_a0;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar17 = *puVar15;
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
          puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
        }
        local_ee8 = (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_e38._120_8_;
        uStack_ee0 = 0;
        ::soplex::infinity::__tls_init();
        local_c18.fpclass = cpp_dec_float_finite;
        local_c18.prec_elem = 0x1c;
        local_c18.data._M_elems[0] = 0;
        local_c18.data._M_elems[1] = 0;
        local_c18.data._M_elems[2] = 0;
        local_c18.data._M_elems[3] = 0;
        local_c18.data._M_elems[4] = 0;
        local_c18.data._M_elems[5] = 0;
        local_c18.data._M_elems[6] = 0;
        local_c18.data._M_elems[7] = 0;
        local_c18.data._M_elems[8] = 0;
        local_c18.data._M_elems[9] = 0;
        local_c18.data._M_elems[10] = 0;
        local_c18.data._M_elems[0xb] = 0;
        local_c18.data._M_elems[0xc] = 0;
        local_c18.data._M_elems[0xd] = 0;
        local_c18.data._M_elems[0xe] = 0;
        local_c18.data._M_elems[0xf] = 0;
        local_c18.data._M_elems[0x10] = 0;
        local_c18.data._M_elems[0x11] = 0;
        local_c18.data._M_elems[0x12] = 0;
        local_c18.data._M_elems[0x13] = 0;
        local_c18.data._M_elems[0x14] = 0;
        local_c18.data._M_elems[0x15] = 0;
        local_c18.data._M_elems[0x16] = 0;
        local_c18.data._M_elems[0x17] = 0;
        local_c18.data._M_elems[0x18] = 0;
        local_c18.data._M_elems[0x19] = 0;
        local_c18.data._M_elems._104_5_ = 0;
        local_c18.data._M_elems[0x1b]._1_3_ = 0;
        local_c18.exp = 0;
        local_c18.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_c18,local_d38);
        pnVar14 = eps;
        pcVar12 = &local_990;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar12->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar23 * -2 + 1) * 4)
          ;
        }
        local_990.exp = (eps->m_backend).exp;
        local_990.neg = (eps->m_backend).neg;
        local_990.fpclass = (eps->m_backend).fpclass;
        local_990.prec_elem = (eps->m_backend).prec_elem;
        puVar15 = local_a0;
        puVar17 = (undefined4 *)local_1028;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar17 = *puVar15;
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
          puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
        }
        local_1028._112_4_ = uVar3;
        local_1028[0x74] = bVar4;
        local_fb0 = (double)local_ee8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)local_1028,&local_c18);
        if (((fpclass_type)local_fb0 != cpp_dec_float_NaN) &&
           (local_990.fpclass != cpp_dec_float_NaN)) {
          iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_1028,&local_990);
          if (0 < iVar5) {
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_390;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4);
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_390._112_4_ = local_e38._112_4_;
            local_390[0x74] = local_e38[0x74];
            local_390._120_8_ = local_e38._120_8_;
            puVar11 = (uint *)local_eb8;
            pnVar14 = &local_410;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = *puVar11;
              puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_410.m_backend.exp = local_eb8._112_4_;
            local_410.m_backend.neg = local_eb8[0x74];
            local_410.m_backend.fpclass = local_eb8._120_4_;
            local_410.m_backend.prec_elem = iStack_e3c;
            pnVar14 = eps;
            pnVar19 = &local_490;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar19->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
              pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_490.m_backend.exp = (eps->m_backend).exp;
            local_490.m_backend.neg = (eps->m_backend).neg;
            local_490.m_backend.fpclass = (eps->m_backend).fpclass;
            local_490.m_backend.prec_elem = (eps->m_backend).prec_elem;
            bVar4 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_390,&local_410,&local_490);
            if (bVar4) {
              local_fb0 = 5.94158821470276e-313;
              local_1028._0_4_ = 0;
              local_1028._4_4_ = 0;
              local_1028._8_4_ = 0;
              local_1028._12_4_ = 0;
              local_1028._16_4_ = 0;
              local_1028._20_4_ = 0;
              local_1028._24_4_ = 0;
              local_1028._28_4_ = 0;
              local_1028._32_4_ = 0;
              local_1028._36_4_ = 0;
              local_1028._40_4_ = 0;
              local_1028._44_4_ = 0;
              local_1028._48_4_ = 0;
              local_1028._52_4_ = 0;
              local_1028._56_4_ = 0;
              local_1028._60_4_ = 0;
              local_1028._64_4_ = 0;
              local_1028._68_4_ = 0;
              local_1028._72_4_ = 0;
              local_1028._76_4_ = 0;
              local_1028._80_4_ = 0;
              local_1028._84_4_ = 0;
              local_1028._88_4_ = 0;
              local_1028._92_4_ = 0;
              local_1028._96_4_ = 0;
              local_1028._100_4_ = 0;
              local_1028._104_5_ = 0;
              local_1028._109_3_ = 0;
              local_1028._112_4_ = 0;
              local_1028[0x74] = false;
              if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_1028 == eps) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_1028,
                           (cpp_dec_float<200U,_int,_void> *)local_db8);
                fVar6 = cpp_dec_float_finite;
                if (local_1028._0_4_ != 0 || (fpclass_type)local_fb0 != cpp_dec_float_finite) {
                  local_1028[0x74] = local_1028[0x74] ^ 1;
                  fVar6 = (fpclass_type)local_fb0;
                }
              }
              else {
                puVar15 = (undefined4 *)local_db8;
                puVar17 = (undefined4 *)local_1028;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  *puVar17 = *puVar15;
                  puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                  puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
                }
                local_1028._112_4_ = local_db8._112_4_;
                local_1028[0x74] = local_db8[0x74];
                local_fb0 = (double)local_db8._120_8_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_1028,&eps->m_backend);
                fVar6 = (fpclass_type)local_fb0;
              }
              if (((local_e38._120_4_ != cpp_dec_float_NaN) && (fVar6 != cpp_dec_float_NaN)) &&
                 (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_e38,
                                     (cpp_dec_float<200U,_int,_void> *)local_1028), -1 < iVar5)) {
                local_ee8 = (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               extract_double(&local_a98);
                local_f98 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            extract_double(&local_b18);
                RVar1 = Random::next_random((Random *)local_fa8);
                local_ef0 = 5.94158821470276e-313;
                local_f68._0_4_ = 0;
                local_f68._4_4_ = 0;
                local_f68._8_4_ = 0;
                local_f68._12_4_ = 0;
                local_f68._16_4_ = 0;
                local_f68._20_4_ = 0;
                local_f68._24_4_ = 0;
                local_f68._28_4_ = 0;
                local_f68._32_4_ = 0;
                local_f68._36_4_ = 0;
                local_f68._40_4_ = 0;
                local_f68._44_4_ = 0;
                local_f68._48_4_ = 0;
                local_f68._52_4_ = 0;
                local_f68._56_4_ = 0;
                local_f68._60_4_ = 0;
                local_f68._64_4_ = 0;
                local_f68._68_4_ = 0;
                local_f68._72_4_ = 0;
                local_f68._76_4_ = 0;
                local_f68._80_4_ = 0;
                local_f68._84_4_ = 0;
                local_f68._88_4_ = 0;
                local_f68._92_4_ = 0;
                local_f68._96_4_ = 0;
                local_f68._100_4_ = 0;
                local_f68._104_5_ = 0;
                local_f68._109_3_ = 0;
                local_f68._112_4_ = 0;
                local_f68[0x74] = false;
                local_fb0._0_4_ = cpp_dec_float_finite;
                local_fb0._4_4_ = 0x1c;
                local_1028._0_4_ = 0;
                local_1028._4_4_ = 0;
                local_1028._8_4_ = 0;
                local_1028._12_4_ = 0;
                local_1028._16_4_ = 0;
                local_1028._20_4_ = 0;
                local_1028._24_4_ = 0;
                local_1028._28_4_ = 0;
                local_1028._32_4_ = 0;
                local_1028._36_4_ = 0;
                local_1028._40_4_ = 0;
                local_1028._44_4_ = 0;
                local_1028._48_4_ = 0;
                local_1028._52_4_ = 0;
                local_1028._56_4_ = 0;
                local_1028._60_4_ = 0;
                local_1028._64_4_ = 0;
                local_1028._68_4_ = 0;
                local_1028._72_4_ = 0;
                local_1028._76_4_ = 0;
                local_1028._80_4_ = 0;
                local_1028._84_4_ = 0;
                local_1028._88_4_ = 0;
                local_1028._92_4_ = 0;
                local_1028._96_4_ = 0;
                local_1028._100_4_ = 0;
                local_1028._104_5_ = 0;
                local_1028._109_3_ = 0;
                local_1028._112_4_ = 0;
                local_1028[0x74] = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_1028,
                           RVar1 * local_f98 + (1.0 - RVar1) * (double)local_ee8);
                puVar11 = (uint *)local_db8;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_f68;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pcVar12->data)._M_elems[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar23 * -8 + 4);
                }
                local_f68._112_4_ = local_db8._112_4_;
                local_f68[0x74] = local_db8[0x74];
                local_ef0 = (double)local_db8._120_8_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_f68,
                           (cpp_dec_float<200U,_int,_void> *)local_1028);
                pnVar10 = (local_f78->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_f68;
                pnVar13 = pnVar10 + uVar21;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar13->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar23 * -8 + 4);
                  pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                pnVar10[uVar21].m_backend.exp = local_f68._112_4_;
                pnVar10[uVar21].m_backend.neg = local_f68[0x74];
                *(double *)&pnVar10[uVar21].m_backend.fpclass = local_ef0;
                pnVar10 = (local_f78->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar21;
                local_fb0 = 5.94158821470276e-313;
                local_1028._0_4_ = 0;
                local_1028._4_4_ = 0;
                local_1028._8_4_ = 0;
                local_1028._12_4_ = 0;
                local_1028._16_4_ = 0;
                local_1028._20_4_ = 0;
                local_1028._24_4_ = 0;
                local_1028._28_4_ = 0;
                local_1028._32_4_ = 0;
                local_1028._36_4_ = 0;
                local_1028._40_4_ = 0;
                local_1028._44_4_ = 0;
                local_1028._48_4_ = 0;
                local_1028._52_4_ = 0;
                local_1028._56_4_ = 0;
                local_1028._60_4_ = 0;
                local_1028._64_4_ = 0;
                local_1028._68_4_ = 0;
                local_1028._72_4_ = 0;
                local_1028._76_4_ = 0;
                local_1028._80_4_ = 0;
                local_1028._84_4_ = 0;
                local_1028._88_4_ = 0;
                local_1028._92_4_ = 0;
                local_1028._96_4_ = 0;
                local_1028._100_4_ = 0;
                local_1028._104_5_ = 0;
                local_1028._109_3_ = 0;
                local_1028._112_4_ = 0;
                local_1028[0x74] = false;
                if ((pointer)local_1028 != pnVar10) {
                  pnVar13 = pnVar10;
                  puVar15 = (undefined4 *)local_1028;
                  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                    *puVar15 = (pnVar13->m_backend).data._M_elems[0];
                    pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
                    puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                  }
                  local_1028._112_4_ = (pnVar10->m_backend).exp;
                  local_1028[0x74] = (pnVar10->m_backend).neg;
                  local_fb0 = *(double *)&(pnVar10->m_backend).fpclass;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_1028,
                           (cpp_dec_float<200U,_int,_void> *)local_e38);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_fa0,
                           (cpp_dec_float<200U,_int,_void> *)local_1028);
              }
            }
          }
        }
        uVar21 = uVar21 - incr;
      } while (-1 < (int)uVar21);
    }
  }
  else {
    uVar21 = ~start + (local_f88->thedelta).super_IdxSet.num;
    if (-1 < (int)uVar21) {
      pnVar10 = (local_f88->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_ee8 = &local_fa0->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_d38 = *(double *)(in_FS_OFFSET + -8);
      local_ec0 = &local_fa0->random;
      local_ec8 = &(local_fa0->theShift).m_backend;
      uStack_d30 = 0;
      local_d28 = -local_d38;
      uStack_d20 = 0x8000000000000000;
      pUVar22 = local_f88;
      do {
        iVar5 = (pUVar22->thedelta).super_IdxSet.idx[uVar21];
        pnVar13 = pnVar10 + iVar5;
        puVar15 = (undefined4 *)local_db8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        }
        local_db8._112_4_ = pnVar10[iVar5].m_backend.exp;
        local_db8[0x74] = pnVar10[iVar5].m_backend.neg;
        local_db8._120_4_ = pnVar10[iVar5].m_backend.fpclass;
        local_db8._124_4_ = pnVar10[iVar5].m_backend.prec_elem;
        pnVar13 = (local_f70->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar16 = pnVar13 + iVar5;
        puVar15 = (undefined4 *)local_eb8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        }
        local_eb8._112_4_ = pnVar13[iVar5].m_backend.exp;
        local_eb8[0x74] = pnVar13[iVar5].m_backend.neg;
        unique0x00012000 = *(double *)&pnVar13[iVar5].m_backend.fpclass;
        pnVar13 = (local_f78->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar16 = pnVar13 + iVar5;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar12->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4);
        }
        local_e38._112_4_ = pnVar13[iVar5].m_backend.exp;
        local_e38[0x74] = pnVar13[iVar5].m_backend.neg;
        local_e38._120_8_ = *(undefined8 *)&pnVar13[iVar5].m_backend.fpclass;
        SVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::dualStatus(local_ee8,
                             (local_fa0->
                             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).theBaseId.data + iVar5);
        if (SVar7 != D_ON_BOTH) {
          fVar6 = (eps->m_backend).fpclass;
          if (fVar6 != cpp_dec_float_NaN && local_db8._120_4_ != cpp_dec_float_NaN) {
            iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_db8,&eps->m_backend);
            if (0 < iVar8) {
              puVar15 = (undefined4 *)local_eb8;
              puVar17 = (undefined4 *)local_890;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar17 = *puVar15;
                puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
              }
              local_890._112_4_ = local_eb8._112_4_;
              local_890[0x74] = local_eb8[0x74];
              local_890._120_8_ = stack0xfffffffffffff1c0;
              ::soplex::infinity::__tls_init();
              local_c20 = 0x1c00000000;
              local_c98 = 0;
              uStack_c90 = 0;
              local_c88 = 0;
              uStack_c80 = 0;
              local_c78 = 0;
              uStack_c70 = 0;
              local_c68 = 0;
              uStack_c60 = 0;
              local_c58 = 0;
              uStack_c50 = 0;
              local_c48 = 0;
              uStack_c40 = 0;
              local_c38 = 0;
              uStack_c30 = 0;
              uStack_c2b = 0;
              uStack_c28 = 0;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_c98,local_d38);
              pnVar14 = eps;
              pnVar19 = &local_510;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar19->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_510.m_backend.exp = (eps->m_backend).exp;
              local_510.m_backend.neg = (eps->m_backend).neg;
              local_510.m_backend.fpclass = (eps->m_backend).fpclass;
              local_510.m_backend.prec_elem = (eps->m_backend).prec_elem;
              bVar4 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_890,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_c98,&local_510);
              pUVar22 = local_f88;
              if (bVar4) {
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_590;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar14->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar23 * -8 + 4);
                  pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                local_590._112_4_ = local_e38._112_4_;
                local_590[0x74] = local_e38[0x74];
                local_590._120_8_ = local_e38._120_8_;
                puVar11 = (uint *)local_eb8;
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_610;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar14->m_backend).data._M_elems[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                  pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                local_610._112_4_ = local_eb8._112_4_;
                local_610[0x74] = local_eb8[0x74];
                local_610._120_8_ = stack0xfffffffffffff1c0;
                pnVar14 = eps;
                pnVar19 = &local_690;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar19->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
                  pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                  pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                local_690.m_backend.exp = (eps->m_backend).exp;
                local_690.m_backend.neg = (eps->m_backend).neg;
                local_690.m_backend.fpclass = (eps->m_backend).fpclass;
                local_690.m_backend.prec_elem = (eps->m_backend).prec_elem;
                bVar4 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_590,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_610,&local_690);
                pUVar22 = local_f88;
                if (bVar4) {
                  local_fb0 = 5.94158821470276e-313;
                  local_1028._0_4_ = 0;
                  local_1028._4_4_ = 0;
                  local_1028._8_4_ = 0;
                  local_1028._12_4_ = 0;
                  local_1028._16_4_ = 0;
                  local_1028._20_4_ = 0;
                  local_1028._24_4_ = 0;
                  local_1028._28_4_ = 0;
                  local_1028._32_4_ = 0;
                  local_1028._36_4_ = 0;
                  local_1028._40_4_ = 0;
                  local_1028._44_4_ = 0;
                  local_1028._48_4_ = 0;
                  local_1028._52_4_ = 0;
                  local_1028._56_4_ = 0;
                  local_1028._60_4_ = 0;
                  local_1028._64_4_ = 0;
                  local_1028._68_4_ = 0;
                  local_1028._72_4_ = 0;
                  local_1028._76_4_ = 0;
                  local_1028._80_4_ = 0;
                  local_1028._84_4_ = 0;
                  local_1028._88_4_ = 0;
                  local_1028._92_4_ = 0;
                  local_1028._96_4_ = 0;
                  local_1028._100_4_ = 0;
                  local_1028._104_5_ = 0;
                  local_1028._109_3_ = 0;
                  local_1028._112_4_ = 0;
                  local_1028[0x74] = false;
                  if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_1028 == eps) {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_1028,
                               (cpp_dec_float<200U,_int,_void> *)local_eb8);
                    fVar6 = cpp_dec_float_finite;
                    if (local_1028._0_4_ != 0 || (fpclass_type)local_fb0 != cpp_dec_float_finite) {
                      local_1028[0x74] = local_1028[0x74] ^ 1;
                      fVar6 = (fpclass_type)local_fb0;
                    }
                  }
                  else {
                    puVar15 = (undefined4 *)local_eb8;
                    puVar17 = (undefined4 *)local_1028;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      *puVar17 = *puVar15;
                      puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                      puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
                    }
                    local_1028._112_4_ = local_eb8._112_4_;
                    local_1028[0x74] = local_eb8[0x74];
                    local_fb0 = stack0xfffffffffffff1c0;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_1028,&eps->m_backend);
                    fVar6 = (fpclass_type)local_fb0;
                  }
                  pcVar12 = &local_ed0[iVar5].m_backend;
                  if (((pcVar12->fpclass != cpp_dec_float_NaN) && (fVar6 != cpp_dec_float_NaN)) &&
                     (local_fa8 = pcVar12,
                     iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(pcVar12,(cpp_dec_float<200U,_int,_void> *)local_1028),
                     -1 < iVar8)) {
                    local_f98 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                extract_double(&local_a98);
                    local_ed8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                extract_double(&local_b18);
                    RVar1 = Random::next_random(local_ec0);
                    local_ef0 = 5.94158821470276e-313;
                    local_f68._0_4_ = 0;
                    local_f68._4_4_ = 0;
                    local_f68._8_4_ = 0;
                    local_f68._12_4_ = 0;
                    local_f68._16_4_ = 0;
                    local_f68._20_4_ = 0;
                    local_f68._24_4_ = 0;
                    local_f68._28_4_ = 0;
                    local_f68._32_4_ = 0;
                    local_f68._36_4_ = 0;
                    local_f68._40_4_ = 0;
                    local_f68._44_4_ = 0;
                    local_f68._48_4_ = 0;
                    local_f68._52_4_ = 0;
                    local_f68._56_4_ = 0;
                    local_f68._60_4_ = 0;
                    local_f68._64_4_ = 0;
                    local_f68._68_4_ = 0;
                    local_f68._72_4_ = 0;
                    local_f68._76_4_ = 0;
                    local_f68._80_4_ = 0;
                    local_f68._84_4_ = 0;
                    local_f68._88_4_ = 0;
                    local_f68._92_4_ = 0;
                    local_f68._96_4_ = 0;
                    local_f68._100_4_ = 0;
                    local_f68._104_5_ = 0;
                    local_f68._109_3_ = 0;
                    local_f68._112_4_ = 0;
                    local_f68[0x74] = false;
                    local_fb0._0_4_ = cpp_dec_float_finite;
                    local_fb0._4_4_ = 0x1c;
                    local_1028._0_4_ = 0;
                    local_1028._4_4_ = 0;
                    local_1028._8_4_ = 0;
                    local_1028._12_4_ = 0;
                    local_1028._16_4_ = 0;
                    local_1028._20_4_ = 0;
                    local_1028._24_4_ = 0;
                    local_1028._28_4_ = 0;
                    local_1028._32_4_ = 0;
                    local_1028._36_4_ = 0;
                    local_1028._40_4_ = 0;
                    local_1028._44_4_ = 0;
                    local_1028._48_4_ = 0;
                    local_1028._52_4_ = 0;
                    local_1028._56_4_ = 0;
                    local_1028._60_4_ = 0;
                    local_1028._64_4_ = 0;
                    local_1028._68_4_ = 0;
                    local_1028._72_4_ = 0;
                    local_1028._76_4_ = 0;
                    local_1028._80_4_ = 0;
                    local_1028._84_4_ = 0;
                    local_1028._88_4_ = 0;
                    local_1028._92_4_ = 0;
                    local_1028._96_4_ = 0;
                    local_1028._100_4_ = 0;
                    local_1028._104_5_ = 0;
                    local_1028._109_3_ = 0;
                    local_1028._112_4_ = 0;
                    local_1028[0x74] = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_1028,
                               RVar1 * local_ed8 + (1.0 - RVar1) * local_f98);
                    if ((cpp_dec_float<200U,_int,_void> *)local_f68 != local_fa8) {
                      pcVar12 = local_fa8;
                      pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_f68;
                      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                        (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                        pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar12 + (ulong)bVar23 * -8 + 4);
                        pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar20 + (ulong)bVar23 * -8 + 4);
                      }
                      local_f68._112_4_ = local_fa8->exp;
                      local_f68[0x74] = local_fa8->neg;
                      local_ef0 = *(double *)&local_fa8->fpclass;
                    }
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                              ((cpp_dec_float<200U,_int,_void> *)local_f68,
                               (cpp_dec_float<200U,_int,_void> *)local_1028);
                    pnVar13 = (local_f70->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    puVar15 = (undefined4 *)local_f68;
                    pnVar16 = pnVar13 + iVar5;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      (pnVar16->m_backend).data._M_elems[0] = *puVar15;
                      puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                    }
                    pnVar13[iVar5].m_backend.exp = local_f68._112_4_;
                    pnVar13[iVar5].m_backend.neg = local_f68[0x74];
                    *(double *)&pnVar13[iVar5].m_backend.fpclass = local_ef0;
                    pnVar13 = (local_f70->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + iVar5;
                    local_fb0 = 5.94158821470276e-313;
                    local_1028._0_4_ = 0;
                    local_1028._4_4_ = 0;
                    local_1028._8_4_ = 0;
                    local_1028._12_4_ = 0;
                    local_1028._16_4_ = 0;
                    local_1028._20_4_ = 0;
                    local_1028._24_4_ = 0;
                    local_1028._28_4_ = 0;
                    local_1028._32_4_ = 0;
                    local_1028._36_4_ = 0;
                    local_1028._40_4_ = 0;
                    local_1028._44_4_ = 0;
                    local_1028._48_4_ = 0;
                    local_1028._52_4_ = 0;
                    local_1028._56_4_ = 0;
                    local_1028._60_4_ = 0;
                    local_1028._64_4_ = 0;
                    local_1028._68_4_ = 0;
                    local_1028._72_4_ = 0;
                    local_1028._76_4_ = 0;
                    local_1028._80_4_ = 0;
                    local_1028._84_4_ = 0;
                    local_1028._88_4_ = 0;
                    local_1028._92_4_ = 0;
                    local_1028._96_4_ = 0;
                    local_1028._100_4_ = 0;
                    local_1028._104_5_ = 0;
                    local_1028._109_3_ = 0;
                    local_1028._112_4_ = 0;
                    local_1028[0x74] = false;
                    if ((pointer)local_1028 != pnVar13) {
                      pnVar16 = pnVar13;
                      puVar15 = (undefined4 *)local_1028;
                      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                        *puVar15 = (pnVar16->m_backend).data._M_elems[0];
                        pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                      }
                      local_1028._112_4_ = (pnVar13->m_backend).exp;
                      local_1028[0x74] = (pnVar13->m_backend).neg;
                      local_fb0 = *(double *)&(pnVar13->m_backend).fpclass;
                    }
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_1028,
                               (cpp_dec_float<200U,_int,_void> *)local_eb8);
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                              (local_ec8,(cpp_dec_float<200U,_int,_void> *)local_1028);
                    pUVar22 = local_f88;
                  }
                }
              }
              goto LAB_005209fa;
            }
            fVar6 = (eps->m_backend).fpclass;
          }
          pnVar14 = eps;
          puVar11 = (uint *)local_1028;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar11 = (pnVar14->m_backend).data._M_elems[0];
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
            puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
          }
          local_1028._112_4_ = (eps->m_backend).exp;
          local_1028[0x74] = (eps->m_backend).neg;
          local_fb0 = (double)CONCAT44((eps->m_backend).prec_elem,fVar6);
          if (local_1028._0_4_ != 0 || fVar6 != cpp_dec_float_finite) {
            local_1028[0x74] = local_1028[0x74] ^ 1;
          }
          if (((fVar6 != cpp_dec_float_NaN) && (local_db8._120_4_ != cpp_dec_float_NaN)) &&
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_db8,
                                 (cpp_dec_float<200U,_int,_void> *)local_1028),
             uVar3 = local_e38._112_4_, iVar8 < 0)) {
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
            puVar11 = local_110;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar11 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4);
              puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
            }
            local_fa8 = (cpp_dec_float<200U,_int,_void> *)CONCAT71(local_fa8._1_7_,local_e38[0x74]);
            local_f98 = (double)local_e38._120_8_;
            uStack_f90 = 0;
            ::soplex::infinity::__tls_init();
            local_d18.fpclass = cpp_dec_float_finite;
            local_d18.prec_elem = 0x1c;
            local_d18.data._M_elems[0] = 0;
            local_d18.data._M_elems[1] = 0;
            local_d18.data._M_elems[2] = 0;
            local_d18.data._M_elems[3] = 0;
            local_d18.data._M_elems[4] = 0;
            local_d18.data._M_elems[5] = 0;
            local_d18.data._M_elems[6] = 0;
            local_d18.data._M_elems[7] = 0;
            local_d18.data._M_elems[8] = 0;
            local_d18.data._M_elems[9] = 0;
            local_d18.data._M_elems[10] = 0;
            local_d18.data._M_elems[0xb] = 0;
            local_d18.data._M_elems[0xc] = 0;
            local_d18.data._M_elems[0xd] = 0;
            local_d18.data._M_elems[0xe] = 0;
            local_d18.data._M_elems[0xf] = 0;
            local_d18.data._M_elems[0x10] = 0;
            local_d18.data._M_elems[0x11] = 0;
            local_d18.data._M_elems[0x12] = 0;
            local_d18.data._M_elems[0x13] = 0;
            local_d18.data._M_elems[0x14] = 0;
            local_d18.data._M_elems[0x15] = 0;
            local_d18.data._M_elems[0x16] = 0;
            local_d18.data._M_elems[0x17] = 0;
            local_d18.data._M_elems[0x18] = 0;
            local_d18.data._M_elems[0x19] = 0;
            local_d18.data._M_elems._104_5_ = 0;
            local_d18.data._M_elems[0x1b]._1_3_ = 0;
            local_d18.exp = 0;
            local_d18.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_d18,local_d28);
            pnVar14 = eps;
            pcVar12 = &local_a10;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar12->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar12 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_a10.exp = (eps->m_backend).exp;
            local_a10.neg = (eps->m_backend).neg;
            local_a10.fpclass = (eps->m_backend).fpclass;
            local_a10.prec_elem = (eps->m_backend).prec_elem;
            puVar11 = local_110;
            puVar18 = (uint *)local_1028;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar18 = *puVar11;
              puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
              puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
            }
            local_1028._112_4_ = uVar3;
            local_1028[0x74] = (byte)local_fa8;
            local_fb0 = local_f98;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_1028,&local_d18);
            pUVar22 = local_f88;
            if ((((fpclass_type)local_fb0 != cpp_dec_float_NaN) &&
                (local_a10.fpclass != cpp_dec_float_NaN)) &&
               (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_1028,&local_a10),
               pUVar22 = local_f88, 0 < iVar8)) {
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_710;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar14->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4)
                ;
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_710._112_4_ = local_e38._112_4_;
              local_710[0x74] = local_e38[0x74];
              local_710._120_8_ = local_e38._120_8_;
              puVar11 = (uint *)local_eb8;
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_790;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar14->m_backend).data._M_elems[0] = *puVar11;
                puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_790._112_4_ = local_eb8._112_4_;
              local_790[0x74] = local_eb8[0x74];
              local_790._120_8_ = stack0xfffffffffffff1c0;
              pnVar14 = eps;
              pnVar19 = &local_810;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar19->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
                pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_810.m_backend.exp = (eps->m_backend).exp;
              local_810.m_backend.neg = (eps->m_backend).neg;
              local_810.m_backend.fpclass = (eps->m_backend).fpclass;
              local_810.m_backend.prec_elem = (eps->m_backend).prec_elem;
              bVar4 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_710,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_790,&local_810);
              if (bVar4) {
                local_fb0 = 5.94158821470276e-313;
                local_1028._0_4_ = 0;
                local_1028._4_4_ = 0;
                local_1028._8_4_ = 0;
                local_1028._12_4_ = 0;
                local_1028._16_4_ = 0;
                local_1028._20_4_ = 0;
                local_1028._24_4_ = 0;
                local_1028._28_4_ = 0;
                local_1028._32_4_ = 0;
                local_1028._36_4_ = 0;
                local_1028._40_4_ = 0;
                local_1028._44_4_ = 0;
                local_1028._48_4_ = 0;
                local_1028._52_4_ = 0;
                local_1028._56_4_ = 0;
                local_1028._60_4_ = 0;
                local_1028._64_4_ = 0;
                local_1028._68_4_ = 0;
                local_1028._72_4_ = 0;
                local_1028._76_4_ = 0;
                local_1028._80_4_ = 0;
                local_1028._84_4_ = 0;
                local_1028._88_4_ = 0;
                local_1028._92_4_ = 0;
                local_1028._96_4_ = 0;
                local_1028._100_4_ = 0;
                local_1028._104_5_ = 0;
                local_1028._109_3_ = 0;
                local_1028._112_4_ = 0;
                local_1028[0x74] = false;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
                if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_1028 != eps) {
                  puVar11 = (uint *)local_1028;
                  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                    *puVar11 = (pcVar12->data)._M_elems[0];
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + (ulong)bVar23 * -8 + 4);
                    puVar11 = puVar11 + (ulong)bVar23 * -2 + 1;
                  }
                  local_1028._112_4_ = local_e38._112_4_;
                  local_1028[0x74] = local_e38[0x74];
                  local_fb0 = (double)local_e38._120_8_;
                  pcVar12 = &eps->m_backend;
                }
                local_fa8 = &local_ed0[iVar5].m_backend;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          ((cpp_dec_float<200U,_int,_void> *)local_1028,pcVar12);
                if (((local_fa8->fpclass != cpp_dec_float_NaN) &&
                    ((fpclass_type)local_fb0 != cpp_dec_float_NaN)) &&
                   (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      (local_fa8,(cpp_dec_float<200U,_int,_void> *)local_1028),
                   iVar8 < 1)) {
                  local_f98 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              extract_double(&local_a98);
                  local_ed8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              extract_double(&local_b18);
                  RVar1 = Random::next_random(local_ec0);
                  local_ef0 = 5.94158821470276e-313;
                  local_f68._0_4_ = 0;
                  local_f68._4_4_ = 0;
                  local_f68._8_4_ = 0;
                  local_f68._12_4_ = 0;
                  local_f68._16_4_ = 0;
                  local_f68._20_4_ = 0;
                  local_f68._24_4_ = 0;
                  local_f68._28_4_ = 0;
                  local_f68._32_4_ = 0;
                  local_f68._36_4_ = 0;
                  local_f68._40_4_ = 0;
                  local_f68._44_4_ = 0;
                  local_f68._48_4_ = 0;
                  local_f68._52_4_ = 0;
                  local_f68._56_4_ = 0;
                  local_f68._60_4_ = 0;
                  local_f68._64_4_ = 0;
                  local_f68._68_4_ = 0;
                  local_f68._72_4_ = 0;
                  local_f68._76_4_ = 0;
                  local_f68._80_4_ = 0;
                  local_f68._84_4_ = 0;
                  local_f68._88_4_ = 0;
                  local_f68._92_4_ = 0;
                  local_f68._96_4_ = 0;
                  local_f68._100_4_ = 0;
                  local_f68._104_5_ = 0;
                  local_f68._109_3_ = 0;
                  local_f68._112_4_ = 0;
                  local_f68[0x74] = false;
                  local_fb0._0_4_ = cpp_dec_float_finite;
                  local_fb0._4_4_ = 0x1c;
                  local_1028._0_4_ = 0;
                  local_1028._4_4_ = 0;
                  local_1028._8_4_ = 0;
                  local_1028._12_4_ = 0;
                  local_1028._16_4_ = 0;
                  local_1028._20_4_ = 0;
                  local_1028._24_4_ = 0;
                  local_1028._28_4_ = 0;
                  local_1028._32_4_ = 0;
                  local_1028._36_4_ = 0;
                  local_1028._40_4_ = 0;
                  local_1028._44_4_ = 0;
                  local_1028._48_4_ = 0;
                  local_1028._52_4_ = 0;
                  local_1028._56_4_ = 0;
                  local_1028._60_4_ = 0;
                  local_1028._64_4_ = 0;
                  local_1028._68_4_ = 0;
                  local_1028._72_4_ = 0;
                  local_1028._76_4_ = 0;
                  local_1028._80_4_ = 0;
                  local_1028._84_4_ = 0;
                  local_1028._88_4_ = 0;
                  local_1028._92_4_ = 0;
                  local_1028._96_4_ = 0;
                  local_1028._100_4_ = 0;
                  local_1028._104_5_ = 0;
                  local_1028._109_3_ = 0;
                  local_1028._112_4_ = 0;
                  local_1028[0x74] = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_1028,
                             RVar1 * local_ed8 + (1.0 - RVar1) * local_f98);
                  if ((cpp_dec_float<200U,_int,_void> *)local_f68 != local_fa8) {
                    pcVar12 = local_fa8;
                    pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_f68;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                      pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar12 + (ulong)bVar23 * -8 + 4);
                      pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar20 + (ulong)bVar23 * -8 + 4);
                    }
                    local_f68._112_4_ = local_fa8->exp;
                    local_f68[0x74] = local_fa8->neg;
                    local_ef0 = *(double *)&local_fa8->fpclass;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_f68,
                             (cpp_dec_float<200U,_int,_void> *)local_1028);
                  pnVar13 = (local_f78->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar15 = (undefined4 *)local_f68;
                  pnVar16 = pnVar13 + iVar5;
                  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                    (pnVar16->m_backend).data._M_elems[0] = *puVar15;
                    puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                    pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                  }
                  pnVar13[iVar5].m_backend.exp = local_f68._112_4_;
                  pnVar13[iVar5].m_backend.neg = local_f68[0x74];
                  *(double *)&pnVar13[iVar5].m_backend.fpclass = local_ef0;
                  pnVar13 = (local_f78->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar5;
                  local_fb0 = 5.94158821470276e-313;
                  local_1028._0_4_ = 0;
                  local_1028._4_4_ = 0;
                  local_1028._8_4_ = 0;
                  local_1028._12_4_ = 0;
                  local_1028._16_4_ = 0;
                  local_1028._20_4_ = 0;
                  local_1028._24_4_ = 0;
                  local_1028._28_4_ = 0;
                  local_1028._32_4_ = 0;
                  local_1028._36_4_ = 0;
                  local_1028._40_4_ = 0;
                  local_1028._44_4_ = 0;
                  local_1028._48_4_ = 0;
                  local_1028._52_4_ = 0;
                  local_1028._56_4_ = 0;
                  local_1028._60_4_ = 0;
                  local_1028._64_4_ = 0;
                  local_1028._68_4_ = 0;
                  local_1028._72_4_ = 0;
                  local_1028._76_4_ = 0;
                  local_1028._80_4_ = 0;
                  local_1028._84_4_ = 0;
                  local_1028._88_4_ = 0;
                  local_1028._92_4_ = 0;
                  local_1028._96_4_ = 0;
                  local_1028._100_4_ = 0;
                  local_1028._104_5_ = 0;
                  local_1028._109_3_ = 0;
                  local_1028._112_4_ = 0;
                  local_1028[0x74] = false;
                  if ((pointer)local_1028 != pnVar13) {
                    pnVar16 = pnVar13;
                    puVar15 = (undefined4 *)local_1028;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      *puVar15 = (pnVar16->m_backend).data._M_elems[0];
                      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                      puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                    }
                    local_1028._112_4_ = (pnVar13->m_backend).exp;
                    local_1028[0x74] = (pnVar13->m_backend).neg;
                    local_fb0 = *(double *)&(pnVar13->m_backend).fpclass;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_1028,
                             (cpp_dec_float<200U,_int,_void> *)local_e38);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (local_ec8,(cpp_dec_float<200U,_int,_void> *)local_1028);
                  pUVar22 = local_f88;
                }
              }
            }
          }
        }
LAB_005209fa:
        uVar21 = uVar21 - incr;
      } while (-1 < (int)uVar21);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMax(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps)
         {
            p_up[i] = x + random.next((double)minrandom, (double)maxrandom);
            theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps)
         {
            p_low[i] = x - random.next((double)minrandom, (double)maxrandom);
            theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         // do not permute these bounds! c.f. computeFrhs2() in spxvecs.cpp
         if(this->dualStatus(this->baseId(i)) == SPxBasisBase<R>::Desc::D_ON_BOTH)
         {
            continue;
         }

         if(x > eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               theShift += p_up[i] - u;
            }
         }
         else if(x < -eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               theShift -= p_low[i] - l;
            }
         }
      }
   }
}